

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O0

void Abc_NtkDressPrintStats(Vec_Ptr_t *vRes,int nNodes0,int nNodes1,abctime Time)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p;
  int local_5c;
  int local_58;
  int Neg [2];
  int Pos [2];
  int PairsOne;
  int PairsAll;
  int PosAll [2];
  int NegAll [2];
  int Entry;
  int k;
  int i;
  Vec_Int_t *vClass;
  abctime Time_local;
  int nNodes1_local;
  int nNodes0_local;
  Vec_Ptr_t *vRes_local;
  
  memset(PosAll,0,8);
  memset(&PairsOne,0,8);
  Pos[1] = 0;
  Pos[0] = 0;
  for (Entry = 0; iVar1 = Vec_PtrSize(vRes), Entry < iVar1; Entry = Entry + 1) {
    p = (Vec_Int_t *)Vec_PtrEntry(vRes,Entry);
    Neg[1] = 0;
    Neg[0] = 0;
    local_58 = 0;
    local_5c = 0;
    for (NegAll[1] = 0; iVar1 = Vec_IntSize(p), NegAll[1] < iVar1; NegAll[1] = NegAll[1] + 1) {
      iVar1 = Vec_IntEntry(p,NegAll[1]);
      iVar2 = Abc_ObjEquivId2NtkId(iVar1);
      if (iVar2 == 0) {
        iVar1 = Abc_ObjEquivId2Polar(iVar1);
        if (iVar1 == 0) {
          Neg[0] = Neg[0] + 1;
        }
        else {
          local_5c = local_5c + 1;
        }
      }
      else {
        iVar1 = Abc_ObjEquivId2Polar(iVar1);
        if (iVar1 == 0) {
          Neg[1] = Neg[1] + 1;
        }
        else {
          local_58 = local_58 + 1;
        }
      }
    }
    PairsOne = Neg[0] + PairsOne;
    PairsAll = Neg[1] + PairsAll;
    PosAll[0] = local_5c + PosAll[0];
    PosAll[1] = local_58 + PosAll[1];
    iVar1 = Abc_MinInt(local_5c + Neg[0],local_58 + Neg[1]);
    Pos[1] = iVar1 + Pos[1];
    iVar1 = Abc_MinInt(local_5c,local_58);
    iVar2 = Abc_MinInt(Neg[0],Neg[1]);
    Pos[0] = iVar1 + iVar2 + Pos[0];
  }
  uVar3 = Vec_PtrSize(vRes);
  printf("Total number of equiv classes                = %7d.\n",(ulong)uVar3);
  printf("Participating nodes from both networks       = %7d.\n",
         (ulong)(uint)(PosAll[0] + PairsOne + PosAll[1] + PairsAll));
  printf("Participating nodes from the first network   = %7d. (%7.2f %% of nodes)\n",
         ((double)(PosAll[0] + PairsOne) * 100.0) / (double)(nNodes0 + 1),
         (ulong)(uint)(PosAll[0] + PairsOne));
  printf("Participating nodes from the second network  = %7d. (%7.2f %% of nodes)\n",
         ((double)(PosAll[1] + PairsAll) * 100.0) / (double)(nNodes1 + 1),
         (ulong)(uint)(PosAll[1] + PairsAll));
  printf("Node pairs (any polarity)                    = %7d. (%7.2f %% of names can be moved)\n",
         ((double)Pos[1] * 100.0) / (double)(nNodes0 + 1),(ulong)(uint)Pos[1]);
  printf("Node pairs (same polarity)                   = %7d. (%7.2f %% of names can be moved)\n",
         ((double)Pos[0] * 100.0) / (double)(nNodes0 + 1),(ulong)(uint)Pos[0]);
  Abc_Print(1,"%s =","Total runtime");
  Abc_Print(1,"%9.2f sec\n",((double)Time * 1.0) / 1000000.0);
  return;
}

Assistant:

void Abc_NtkDressPrintStats( Vec_Ptr_t * vRes, int nNodes0, int nNodes1, abctime Time )
{
    Vec_Int_t * vClass;
    int i, k, Entry;
    int NegAll[2] = {0}, PosAll[2] = {0}, PairsAll = 0, PairsOne = 0;
    int Pos[2], Neg[2];
    // count the number of equivalences in each class
    Vec_PtrForEachEntry( Vec_Int_t *, vRes, vClass, i )
    {
        Pos[0] = Pos[1] = 0;
        Neg[0] = Neg[1] = 0;
        Vec_IntForEachEntry( vClass, Entry, k )
        {
            if ( Abc_ObjEquivId2NtkId(Entry) )
            {
                if ( Abc_ObjEquivId2Polar(Entry) )
                    Neg[1]++; // negative polarity in network 1
                else
                    Pos[1]++; // positive polarity in network 1
            }
            else
            {
                if ( Abc_ObjEquivId2Polar(Entry) )
                    Neg[0]++; // negative polarity in network 0
                else
                    Pos[0]++; // positive polarity in network 0
            }
        }
        PosAll[0] += Pos[0]; // total positive polarity in network 0
        PosAll[1] += Pos[1]; // total positive polarity in network 1
        NegAll[0] += Neg[0]; // total negative polarity in network 0
        NegAll[1] += Neg[1]; // total negative polarity in network 1

        // assuming that the name can be transferred to only one node
        PairsAll += Abc_MinInt(Neg[0] + Pos[0], Neg[1] + Pos[1]);
        PairsOne += Abc_MinInt(Neg[0], Neg[1]) + Abc_MinInt(Pos[0], Pos[1]);
    }
    printf( "Total number of equiv classes                = %7d.\n", Vec_PtrSize(vRes) );
    printf( "Participating nodes from both networks       = %7d.\n", NegAll[0]+PosAll[0]+NegAll[1]+PosAll[1] );
    printf( "Participating nodes from the first network   = %7d. (%7.2f %% of nodes)\n", NegAll[0]+PosAll[0], 100.0*(NegAll[0]+PosAll[0])/(nNodes0+1) );
    printf( "Participating nodes from the second network  = %7d. (%7.2f %% of nodes)\n", NegAll[1]+PosAll[1], 100.0*(NegAll[1]+PosAll[1])/(nNodes1+1) );
    printf( "Node pairs (any polarity)                    = %7d. (%7.2f %% of names can be moved)\n", PairsAll, 100.0*PairsAll/(nNodes0+1) );
    printf( "Node pairs (same polarity)                   = %7d. (%7.2f %% of names can be moved)\n", PairsOne, 100.0*PairsOne/(nNodes0+1) );
    ABC_PRT( "Total runtime", Time );
}